

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_used_firstpass_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::CpuUsedFirstpassTest::BeginPassHook(CpuUsedFirstpassTest *this)

{
  uint in_ESI;
  
  anon_unknown.dwarf_901229::CpuUsedFirstpassTest::BeginPassHook
            ((CpuUsedFirstpassTest *)(this + -0x18),in_ESI);
  return;
}

Assistant:

void BeginPassHook(unsigned int pass) override {
    psnr_ = 0.0;
    nframes_ = 0;

    if (pass == 0)
      cpu_used_ = first_pass_cpu_used_;
    else
      cpu_used_ = second_pass_cpu_used_;
  }